

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

void Gia_GlaAddToCounters(Gla_Man_t *p,Vec_Int_t *vCore)

{
  int i;
  Gla_Obj_t *pGVar1;
  int i_00;
  
  for (i_00 = 0; i_00 < vCore->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(vCore,i_00);
    pGVar1 = Gla_ManObj(p,i);
    Vec_IntAddToEntry(p->vCoreCounts,pGVar1->iGiaObj,1);
  }
  return;
}

Assistant:

void Gia_GlaAddToCounters( Gla_Man_t * p, Vec_Int_t * vCore )
{
    Gla_Obj_t * pGla;
    int i;
    Gla_ManForEachObjAbsVec( vCore, p, pGla, i )
        Vec_IntAddToEntry( p->vCoreCounts, pGla->iGiaObj, 1 );
}